

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encrypt.c
# Opt level: O2

_Bool COSE_Enveloped_Free(HCOSE_ENVELOPED h)

{
  _Bool _Var1;
  
  _Var1 = IsValidEnvelopedHandle(h);
  if (_Var1) {
    if (*(int *)(h + 0x10) < 2) {
      _COSE_RemoveFromList(&EnvelopedRoot,(COSE *)h);
      _COSE_Enveloped_Release((COSE_Enveloped *)h);
      free(h);
    }
    else {
      *(int *)(h + 0x10) = *(int *)(h + 0x10) + -1;
    }
  }
  return _Var1;
}

Assistant:

bool COSE_Enveloped_Free(HCOSE_ENVELOPED h)
{
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context *context;
#endif
	COSE_Enveloped * p = (COSE_Enveloped *)h;

	if (!IsValidEnvelopedHandle(h)) return false;

	if (p->m_message.m_refCount > 1) {
		p->m_message.m_refCount--;
		return true;
	}

#ifdef USE_CBOR_CONTEXT
	context = &((COSE_Enveloped *)h)->m_message.m_allocContext;
#endif

	_COSE_RemoveFromList(&EnvelopedRoot, &p->m_message);

	_COSE_Enveloped_Release((COSE_Enveloped *)h);

	COSE_FREE((COSE_Enveloped *)h, context);

	return true;
}